

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int Run<std::_Bind<int(*(std::__cxx11::string))(std::__cxx11::string_const&)>>
              (_Bind<int_(*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *f,size_t retries)

{
  int iVar1;
  string local_3e8 [32];
  stringstream local_3c8 [8];
  stringstream stream_1;
  ostream local_3b8 [376];
  _Bind<int_(*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_240;
  int local_214;
  duration<long,std::ratio<1l,1l>> local_210 [8];
  string local_208 [32];
  stringstream local_1e8 [8];
  stringstream stream;
  ostream local_1d8 [392];
  _Bind<int_(*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_50;
  int local_24;
  size_t sStack_20;
  int result;
  size_t retries_local;
  _Bind<int_(*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *f_local;
  
  sStack_20 = retries;
  retries_local = (size_t)f;
  std::
  _Bind<int_(*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::_Bind(&local_50,f);
  iVar1 = TryRun<std::_Bind<int(*(std::__cxx11::string))(std::__cxx11::string_const&)>>(&local_50);
  std::
  _Bind<int_(*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~_Bind(&local_50);
  f_local._4_4_ = iVar1;
  if ((iVar1 != 0) && (local_24 = iVar1, sStack_20 != 0)) {
    do {
      if (sStack_20 == 0) {
        sStack_20 = sStack_20 - 1;
        std::__cxx11::stringstream::stringstream(local_3c8);
        std::operator<<(local_3b8,"Too many retries, giving up!\n");
        std::__cxx11::stringstream::str();
        Logger::Log(3,local_3e8);
        std::__cxx11::string::~string(local_3e8);
        std::__cxx11::stringstream::~stringstream(local_3c8);
        return local_24;
      }
      sStack_20 = sStack_20 - 1;
      std::__cxx11::stringstream::stringstream(local_1e8);
      std::operator<<(local_1d8,"Command failed, retrying...\n");
      std::__cxx11::stringstream::str();
      Logger::Log(2,local_208);
      std::__cxx11::string::~string(local_208);
      std::__cxx11::stringstream::~stringstream(local_1e8);
      local_214 = 1;
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_210,&local_214);
      std::this_thread::sleep_for<long,std::ratio<1l,1l>>
                ((duration<long,_std::ratio<1L,_1L>_> *)local_210);
      std::
      _Bind<int_(*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::_Bind(&local_240,f);
      local_24 = TryRun<std::_Bind<int(*(std::__cxx11::string))(std::__cxx11::string_const&)>>
                           (&local_240);
      std::
      _Bind<int_(*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~_Bind(&local_240);
    } while (local_24 != 0);
    f_local._4_4_ = 0;
  }
  return f_local._4_4_;
}

Assistant:

int Run(T f, size_t retries)
{
    auto result = TryRun(f);

    // success or no retry allowed
    if (!result || !retries) {
        return result;
    }

    while (retries-- > 0) {
        LOG_WARN("Command failed, retrying...\n");
        std::this_thread::sleep_for(std::chrono::seconds(1));
        result = TryRun(f);
        if (!result) {
            return 0;
        }
    }
    LOG_ERROR("Too many retries, giving up!\n");
    return result;
}